

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::ListDiscreteQuantile::GetFunction<duckdb::string_t,duckdb::QuantileStringType>
          (AggregateFunction *__return_storage_ptr__,ListDiscreteQuantile *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_59;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType result_type;
  
  LogicalType::LIST(&result_type,(LogicalType *)this);
  LogicalType::LogicalType(&local_58,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = &local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,&result_type,
             AggregateFunction::
             StateSize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>,
             AggregateFunction::
             StateInitialize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListOperation<duckdb::string_t,true>,(duckdb::AggregateDestructorType)1>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
             ,AggregateFunction::
              StateCombine<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListOperation<duckdb::string_t,true>>
             ,AggregateFunction::
              StateFinalize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::list_entry_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
             ,AggregateFunction::
              UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
             ,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListOperation<duckdb::string_t,true>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType(&local_58);
  LogicalType::~LogicalType(&result_type);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  __return_storage_ptr__->window =
       QuantileListOperation<duckdb::string_t,true>::
       Window<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::list_entry_t>
  ;
  __return_storage_ptr__->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t>
  ;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &type) {
		using STATE = QuantileState<INPUT_TYPE, TYPE_OP>;
		using OP = QuantileListOperation<INPUT_TYPE, true>;
		auto fun = QuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::template Window<STATE, INPUT_TYPE, list_entry_t>;
		fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}